

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
::internal_emplace<phmap::priv::(anonymous_namespace)::InsertMultiHintData_const&>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
           *this,iterator iter,InsertMultiHintData *args)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  field_type fVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  template_ElementType<1UL> *ptVar7;
  undefined7 extraout_var;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *pbVar8;
  btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *this_00;
  allocator_type *alloc;
  allocator_type *extraout_RDX;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar9;
  int iVar10;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *pbVar11;
  ulong uVar12;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *i;
  size_type i_00;
  ulong i_01;
  iterator iVar13;
  iterator iter_local;
  slot_type *local_38;
  
  pbVar8 = iter.node;
  iter_local.position = iter.position;
  this_00 = (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
             *)args;
  pbVar11 = pbVar8;
  iter_local.node = pbVar8;
  bVar1 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::leaf(pbVar8);
  iVar10 = (int)pbVar11;
  if (!bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_&,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_*>
    ::operator--(&iter_local);
    iter_local.position = iter_local.position + 1;
    pbVar8 = iter_local.node;
  }
  bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::max_count(pbVar8);
  bVar3 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::count(iter_local.node);
  if (bVar3 == bVar2) {
    if (bVar2 < 0x1e) {
      if (iter_local.node !=
          *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            **)this) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <const phmap::priv::(anonymous namespace)::InsertMultiHintData &>]"
                     );
      }
      this_00 = (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                 *)0x1e;
      if ((byte)(bVar2 * '\x02') < 0x1e) {
        this_00 = (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                   *)(ulong)(byte)(bVar2 * '\x02');
      }
      iter_local.node =
           btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
           ::new_leaf_root_node(this_00,iVar10);
      pbVar11 = *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                  **)this;
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
      ::swap(iter_local.node,pbVar11,alloc);
      btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
      ::delete_leaf_node(*(btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                           **)this,pbVar11);
      *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
        **)this = iter_local.node;
      *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
        **)(this + 8) = iter_local.node;
    }
    else {
      btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
      ::rebalance_or_split
                ((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                  *)this,&iter_local);
    }
  }
  pbVar11 = iter_local.node;
  uVar12 = (ulong)iter_local.position;
  bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::count(iter_local.node);
  if (uVar12 <= bVar2) {
    bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            ::count(pbVar11);
    if (uVar12 < bVar2) {
      bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              ::count(pbVar11);
      bVar3 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              ::count(pbVar11);
      local_38 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                 ::slot(pbVar11,(ulong)bVar3 - 1);
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
      ::value_init<phmap::priv::(anonymous_namespace)::InsertMultiHintData*>
                ((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
                  *)pbVar11,(ulong)bVar2,(allocator_type *)&local_38,(InsertMultiHintData **)this_00
                );
      bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              ::count(pbVar11);
      alloc_00 = extraout_RDX;
      for (i_00 = (ulong)bVar2 - 2; uVar12 < i_00 + 1; i_00 = i_00 - 1) {
        psVar5 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                 ::slot(pbVar11,i_00);
        psVar6 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                 ::slot(pbVar11,i_00 + 1);
        *psVar6 = *psVar5;
        alloc_00 = extraout_RDX_00;
      }
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
      ::value_destroy(pbVar11,uVar12,alloc_00);
    }
    btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
    ::slot(pbVar11,uVar12);
    psVar5 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
             ::slot(pbVar11,uVar12);
    iVar10 = args->not_key;
    psVar5->key = args->key;
    psVar5->not_key = iVar10;
    fVar4 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            ::count(pbVar11);
    ptVar7 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
                              *)pbVar11);
    ptVar7[2] = fVar4 + '\x01';
    bVar1 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            ::leaf(pbVar11);
    pbVar8 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              *)CONCAT71(extraout_var,bVar1);
    uVar9 = extraout_RDX_01;
    if (!bVar1) {
      bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              ::count(pbVar11);
      pbVar8 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                *)(ulong)bVar2;
      i = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
           *)(uVar12 + 1);
      uVar9 = extraout_RDX_02;
      if (i < pbVar8) {
        bVar2 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                ::count(pbVar11);
        uVar12 = (ulong)bVar2;
        while ((int)i < (int)uVar12) {
          i_01 = (ulong)((int)uVar12 - 1);
          pbVar8 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                   ::child(pbVar11,i_01);
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::set_child(pbVar11,uVar12,pbVar8);
          uVar12 = i_01;
        }
        pbVar8 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                  *)btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                    ::mutable_child(pbVar11,(size_type)i);
        uVar9 = extraout_RDX_03;
      }
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    iVar13._8_8_ = uVar9;
    iVar13.node = pbVar8;
    return iVar13;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <const phmap::priv::(anonymous namespace)::InsertMultiHintData &>]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }